

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

size_t id_find(nni_id_map *m,uint64_t id)

{
  ulong uVar1;
  size_t start;
  size_t index;
  uint64_t id_local;
  nni_id_map *m_local;
  
  if (m->id_count != 0) {
    uVar1 = id & m->id_cap - 1;
    start = uVar1;
    do {
      if ((m->id_entries[start].key == id) && (m->id_entries[start].val != (void *)0x0)) {
        return start;
      }
      if (m->id_entries[start].skips == 0) {
        return 0xffffffffffffffff;
      }
      start = start * 5 + 1 & (ulong)(m->id_cap - 1);
    } while (start != uVar1);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t
id_find(nni_id_map *m, uint64_t id)
{
	size_t index;
	size_t start;
	if (m->id_count == 0) {
		return ((size_t) -1);
	}

	index = ID_INDEX(m, id);
	start = index;
	for (;;) {
		// The value of ihe_key is only valid if ihe_val is not NULL.
		if ((m->id_entries[index].key == id) &&
		    (m->id_entries[index].val != NULL)) {
			return (index);
		}
		if (m->id_entries[index].skips == 0) {
			return ((size_t) -1);
		}
		index = ID_NEXT(m, index);

		if (index == start) {
			break;
		}
	}

	return ((size_t) -1);
}